

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

bool __thiscall cmFindLibraryHelper::HasValidSuffix(cmFindLibraryHelper *this,string *name)

{
  const_iterator cVar1;
  bool bVar2;
  __type _Var3;
  reference pbVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_5c;
  undefined1 local_58 [8];
  string suffix;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  const_iterator si;
  string *name_local;
  cmFindLibraryHelper *this_local;
  
  si._M_current = name;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Suffixes);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_28,&local_30);
  while( true ) {
    suffix.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Suffixes);
    bVar2 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&suffix.field_2 + 8));
    if (!bVar2) break;
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_28);
    std::__cxx11::string::string((string *)local_58,(string *)pbVar4);
    uVar5 = std::__cxx11::string::length();
    uVar6 = std::__cxx11::string::length();
    cVar1 = si;
    if (uVar6 < uVar5) {
      std::__cxx11::string::size();
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&local_80,(ulong)cVar1._M_current);
      _Var3 = std::operator==(&local_80,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58);
      std::__cxx11::string::~string((string *)&local_80);
      if (_Var3) {
        this_local._7_1_ = 1;
        local_5c = 1;
      }
      else {
        std::__cxx11::string::operator+=((string *)local_58,".");
        lVar7 = std::__cxx11::string::find((string *)si._M_current,(ulong)local_58);
        if (lVar7 == -1) {
          local_5c = 0;
        }
        else {
          this_local._7_1_ = 1;
          local_5c = 1;
        }
      }
    }
    else {
      local_5c = 4;
    }
    std::__cxx11::string::~string((string *)local_58);
    if ((local_5c != 0) && (local_5c == 1)) goto LAB_00733998;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  }
  this_local._7_1_ = 0;
LAB_00733998:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFindLibraryHelper::HasValidSuffix(std::string const& name)
{
  for(std::vector<std::string>::const_iterator si = this->Suffixes.begin();
      si != this->Suffixes.end(); ++si)
    {
    std::string suffix = *si;
    if(name.length() <= suffix.length())
      {
      continue;
      }
    // Check if the given name ends in a valid library suffix.
    if(name.substr(name.size()-suffix.length()) == suffix)
      {
      return true;
      }
    // Check if a valid library suffix is somewhere in the name,
    // this may happen e.g. for versioned shared libraries: libfoo.so.2
    suffix += ".";
    if(name.find(suffix) != name.npos)
      {
      return true;
      }
    }
  return false;
}